

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t
validate_config(aom_codec_alg_priv_t_conflict *ctx,aom_codec_enc_cfg_t *cfg,av1_extracfg *extra_cfg)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  aom_rc_mode aVar6;
  aom_enc_pass aVar7;
  aom_tune_metric aVar8;
  void *pvVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  char *pcVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  
  uVar2 = cfg->g_w;
  if (uVar2 - 1 < 0x10000) {
    uVar3 = cfg->g_h;
    if (uVar3 - 1 < 0x10000) {
      uVar4 = cfg->g_forced_max_frame_width;
      if (uVar4 < 0x10001) {
        uVar5 = cfg->g_forced_max_frame_height;
        if (uVar5 < 0x10001) {
          if (uVar4 == 0 || uVar2 <= uVar4) {
            if (uVar5 == 0 || uVar3 <= uVar5) {
              if (uVar4 != 0) {
                uVar2 = uVar4;
              }
              if (uVar5 != 0) {
                uVar3 = uVar5;
              }
              if ((ulong)uVar3 * (ulong)uVar2 < 0x40000001) {
                if ((cfg->g_timebase).den - 1U < 1000000000) {
                  if ((cfg->g_timebase).num - 1U < 1000000000) {
                    uVar2 = cfg->g_profile;
                    if (uVar2 < 3) {
                      if (cfg->rc_target_bitrate < 0x1e8481) {
                        if (cfg->rc_max_quantizer < 0x40) {
                          if (cfg->rc_max_quantizer < cfg->rc_min_quantizer) {
                            pcVar12 = "rc_min_quantizer out of range [..cfg->rc_max_quantizer]";
                          }
                          else if (extra_cfg->lossless < 2) {
                            bVar1 = extra_cfg->aq_mode;
                            if (bVar1 < 4) {
                              if (extra_cfg->deltaq_mode < 7) {
                                uVar3 = cfg->g_usage;
                                if (extra_cfg->deltaq_mode == 6 && uVar3 != 2) {
                                  pcVar12 = 
                                  "Variance Boost (deltaq_mode = 6) can only be set in all intra mode"
                                  ;
                                }
                                else if (extra_cfg->deltalf_mode < 2) {
                                  if (extra_cfg->frame_periodic_boost < 2) {
                                    if (uVar3 < 3) {
                                      if (cfg->g_threads < 0x41) {
                                        aVar6 = cfg->rc_end_usage;
                                        if (aVar6 < 4) {
                                          if (cfg->rc_undershoot_pct < 0x65) {
                                            if (cfg->rc_overshoot_pct < 0x65) {
                                              if (cfg->rc_2pass_vbr_bias_pct < 0x65) {
                                                if (cfg->kf_mode < 2) {
                                                  if (cfg->rc_dropframe_thresh < 0x65) {
                                                    aVar7 = cfg->g_pass;
                                                    if (aVar7 < 4) {
                                                      if (cfg->g_lag_in_frames < 0x31) {
                                                        if (uVar3 == 2) {
                                                          if (cfg->g_lag_in_frames != 0) {
                                                            pcVar12 = 
                                                  "g_lag_in_frames out of range [..0]";
                                                  goto LAB_001898fa;
                                                  }
                                                  if (cfg->kf_max_dist != 0) {
                                                    pcVar12 = "kf_max_dist out of range [..0]";
                                                    goto LAB_001898fa;
                                                  }
                                                  }
                                                  uVar4 = extra_cfg->min_gf_interval;
                                                  if (uVar4 < 0x30) {
                                                    uVar5 = extra_cfg->max_gf_interval;
                                                    if (uVar5 < 0x30) {
                                                      uVar15 = 2;
                                                      if (2 < uVar4) {
                                                        uVar15 = uVar4;
                                                      }
                                                      if ((uVar5 == 0) || (uVar15 <= uVar5)) {
                                                        uVar4 = extra_cfg->gf_min_pyr_height;
                                                        if (uVar4 < 6) {
                                                          if (extra_cfg->gf_max_pyr_height < 6) {
                                                            if (extra_cfg->gf_max_pyr_height < uVar4
                                                               ) {
                                                              pcVar12 = 
                                                  "gf_min_pyr_height must be less than or equal to gf_max_pyramid_height"
                                                  ;
                                                  }
                                                  else if (cfg->rc_resize_mode < 4) {
                                                    if (cfg->rc_resize_denominator - 8 < 9) {
                                                      if (cfg->rc_resize_kf_denominator - 8 < 9) {
                                                        if (cfg->rc_superres_mode <
                                                            (AOM_SUPERRES_AUTO|AOM_SUPERRES_FIXED))
                                                        {
                                                          if (cfg->rc_superres_denominator - 8 < 9)
                                                          {
                                                            if (cfg->rc_superres_kf_denominator - 8
                                                                < 9) {
                                                              if (cfg->rc_superres_qthresh - 1 <
                                                                  0x3f) {
                                                                if (cfg->rc_superres_kf_qthresh - 1
                                                                    < 0x3f) {
                                                                  if (extra_cfg->cdf_update_mode < 3
                                                                     ) {
                                                                    if (extra_cfg->
                                                                        motion_vector_unit_test < 3)
                                                                    {
                                                                      if (extra_cfg->
                                                                          sb_multipass_unit_test < 2
                                                                         ) {
                                                                        if (extra_cfg->
                                                                            ext_tile_debug < 2) {
                                                                          if (extra_cfg->
                                                                              enable_auto_alt_ref <
                                                                              2) {
                                                                            if (extra_cfg->
                                                                                enable_auto_bwd_ref
                                                                                < 3) {
                                                                              pcVar12 = 
                                                  "cpu_used out of range [0..(cfg->g_usage == AOM_USAGE_REALTIME) ? 12 : 9]"
                                                  ;
                                                  if ((-1 < extra_cfg->cpu_used) &&
                                                     ((uint)extra_cfg->cpu_used <=
                                                      (uint)(uVar3 == 1) * 3 + 9)) {
                                                    if (extra_cfg->noise_sensitivity < 7) {
                                                      if (extra_cfg->superblock_size <
                                                          (AOM_SUPERBLOCK_SIZE_DYNAMIC|
                                                          AOM_SUPERBLOCK_SIZE_128X128)) {
                                                        if (cfg->large_scale_tile < 2) {
                                                          if (extra_cfg->single_tile_decoding < 2) {
                                                            if (extra_cfg->enable_rate_guide_deltaq
                                                                < 2) {
                                                              if (extra_cfg->row_mt < 2) {
                                                                if (extra_cfg->fp_mt < 2) {
                                                                  if (extra_cfg->tile_columns < 7) {
                                                                    if (extra_cfg->tile_rows < 7) {
                                                                      if (extra_cfg->auto_tiles < 2)
                                                                      {
                                                                        if (cfg->monochrome < 2) {
                                                                          if (bVar1 == 0 ||
                                                                              cfg->large_scale_tile
                                                                              == 0) {
                                                                            if (extra_cfg->sharpness
                                                                                < 8) {
                                                                              if (extra_cfg->
                                                                                  arnr_max_frames <
                                                                                  0x10) {
                                                                                if (extra_cfg->
                                                                                    arnr_strength <
                                                                                    7) {
                                                                                  if (extra_cfg->
                                                                                      cq_level <
                                                                                      0x40) {
                                                                                    if (cfg->
                                                  g_bit_depth - AOM_BITS_8 < 5) {
                                                    if (cfg->g_input_bit_depth - 8 < 5) {
                                                      if (extra_cfg->content < AOM_CONTENT_INVALID)
                                                      {
                                                        if (AOM_RC_FIRST_PASS < aVar7) {
                                                          pvVar9 = (cfg->rc_twopass_stats_in).buf;
                                                          uVar10 = (cfg->rc_twopass_stats_in).sz;
                                                          auVar11._8_8_ = 0;
                                                          auVar11._0_8_ = uVar10 >> 3;
                                                          if (pvVar9 == (void *)0x0) {
                                                            pcVar12 = 
                                                  "rc_twopass_stats_in.buf not set.";
                                                  goto LAB_001898fa;
                                                  }
                                                  if (uVar10 != ((uVar10 >> 3) / 0x1d) * 0xe8) {
                                                    pcVar12 = 
                                                  "rc_twopass_stats_in.sz indicates truncated packet."
                                                  ;
                                                  goto LAB_001898fa;
                                                  }
                                                  if (uVar10 < 0x1d0) {
                                                    pcVar12 = 
                                                  "rc_twopass_stats_in requires at least two packets."
                                                  ;
                                                  goto LAB_001898fa;
                                                  }
                                                  iVar13 = SUB164(auVar11 * ZEXT816(
                                                  0x8d3dcb08d3dcb09),8);
                                                  if (iVar13 + -1 !=
                                                      (int)(*(double *)
                                                             ((long)pvVar9 +
                                                             (long)iVar13 * 0xe8 + -0x38) + 0.5)) {
                                                    pcVar12 = 
                                                  "rc_twopass_stats_in missing EOS stats packet";
                                                  goto LAB_001898fa;
                                                  }
                                                  }
                                                  iVar13 = extra_cfg->passes;
                                                  if (iVar13 != -1) {
                                                    if (aVar7 == AOM_RC_ONE_PASS && iVar13 != 1) {
                                                      pcVar12 = "One pass encoding but passes != 1."
                                                      ;
                                                      goto LAB_001898fa;
                                                    }
                                                    if (iVar13 < (int)aVar7) {
                                                      pcVar12 = 
                                                  "Current pass is larger than total number of passes."
                                                  ;
                                                  goto LAB_001898fa;
                                                  }
                                                  }
                                                  if (uVar2 != 2) {
                                                    if ((uVar2 == 1) && (cfg->monochrome != 0)) {
                                                      pcVar12 = 
                                                  "Monochrome is not supported in profile 1";
                                                  goto LAB_001898fa;
                                                  }
                                                  if (AOM_BITS_10 < cfg->g_bit_depth) {
                                                    pcVar12 = 
                                                  "Codec bit-depth 12 not supported in profile < 2";
                                                  goto LAB_001898fa;
                                                  }
                                                  if (10 < cfg->g_input_bit_depth) {
                                                    pcVar12 = 
                                                  "Source bit-depth 12 not supported in profile < 2"
                                                  ;
                                                  goto LAB_001898fa;
                                                  }
                                                  }
                                                  if (aVar6 == AOM_Q) {
                                                    if (1 < cfg->use_fixed_qp_offsets) {
                                                      pcVar12 = 
                                                  "use_fixed_qp_offsets out of range [..1]";
                                                  goto LAB_001898fa;
                                                  }
                                                  }
                                                  else if (cfg->use_fixed_qp_offsets != 0) {
                                                    pcVar12 = 
                                                  "--use_fixed_qp_offsets can only be used with --end-usage=q"
                                                  ;
                                                  goto LAB_001898fa;
                                                  }
                                                  if (extra_cfg->color_primaries -
                                                      AOM_CICP_CP_BT_709 < 0x16) {
                                                    if (extra_cfg->transfer_characteristics -
                                                        AOM_CICP_TC_BT_709 < 0x12) {
                                                      if (extra_cfg->matrix_coefficients <
                                                          AOM_CICP_MC_RESERVED_15) {
                                                        if ((uint)extra_cfg->color_range < 2) {
                                                          if (aVar7 == AOM_RC_ONE_PASS &&
                                                              aVar6 == AOM_VBR) {
                                                            if (10000 < extra_cfg->
                                                                        vbr_corpus_complexity_lap) {
                                                              pcVar12 = 
                                                  "vbr_corpus_complexity_lap out of range [..MAX_VBR_CORPUS_COMPLEXITY]"
                                                  ;
                                                  goto LAB_001898fa;
                                                  }
                                                  }
                                                  else if (extra_cfg->vbr_corpus_complexity_lap != 0
                                                          ) {
                                                    pcVar12 = 
                                                  "VBR corpus complexity is supported only in the case of single pass VBR mode."
                                                  ;
                                                  goto LAB_001898fa;
                                                  }
                                                  aVar8 = extra_cfg->tuning;
                                                  if (aVar8 == AOM_TUNE_BUTTERAUGLI) {
                                                    pcVar12 = 
                                                  "This error may be related to the wrong configuration options: try to set -DCONFIG_TUNE_BUTTERAUGLI=1 at the time CMake is run."
                                                  ;
                                                  }
                                                  else if ((aVar8 & 0xfffffffc) ==
                                                           AOM_TUNE_VMAF_WITH_PREPROCESSING) {
                                                    pcVar12 = 
                                                  "This error may be related to the wrong configuration options: try to set -DCONFIG_TUNE_VMAF=1 at the time CMake is run."
                                                  ;
                                                  }
                                                  else if (aVar8 < (AOM_TUNE_BUTTERAUGLI|
                                                                   AOM_TUNE_VMAF_WITH_PREPROCESSING)
                                                          ) {
                                                    if (extra_cfg->dist_metric < 2) {
                                                      if (extra_cfg->timing_info_type <
                                                          (AOM_TIMING_DEC_MODEL|AOM_TIMING_EQUAL)) {
                                                        if ((uint)extra_cfg->film_grain_test_vector
                                                            < 0x11) {
                                                          if (extra_cfg->lossless != 0) {
                                                            if (bVar1 != 0) {
                                                              pcVar12 = 
                                                  "Only --aq_mode=0 can be used with --lossless=1.";
                                                  goto LAB_001898fa;
                                                  }
                                                  if (extra_cfg->enable_chroma_deltaq != 0) {
                                                    pcVar12 = 
                                                  "Only --enable_chroma_deltaq=0 can be used with --lossless=1."
                                                  ;
                                                  goto LAB_001898fa;
                                                  }
                                                  }
                                                  if (extra_cfg->max_reference_frames - 3U < 5) {
                                                    if ((uint)extra_cfg->
                                                              enable_reduced_reference_set < 2) {
                                                      if (extra_cfg->enable_low_complexity_decode <
                                                          2) {
                                                        if (extra_cfg->chroma_subsampling_x < 2) {
                                                          if (extra_cfg->chroma_subsampling_y < 2) {
                                                            if (extra_cfg->matrix_coefficients ==
                                                                AOM_CICP_MC_IDENTITY &&
                                                                (extra_cfg->chroma_subsampling_y !=
                                                                 0 || extra_cfg->
                                                                      chroma_subsampling_x != 0)) {
                                                              pcVar12 = 
                                                  "Subsampling must be 0 with AOM_CICP_MC_IDENTITY."
                                                  ;
                                                  }
                                                  else if (extra_cfg->disable_trellis_quant < 4) {
                                                    if (extra_cfg->coeff_cost_upd_freq <
                                                        NUM_COST_UPDATE_TYPES) {
                                                      if (extra_cfg->mode_cost_upd_freq <
                                                          NUM_COST_UPDATE_TYPES) {
                                                        if (extra_cfg->mv_cost_upd_freq <
                                                            NUM_COST_UPDATE_TYPES) {
                                                          if (extra_cfg->dv_cost_upd_freq <
                                                              NUM_COST_UPDATE_TYPES) {
                                                            if (extra_cfg->min_partition_size - 4U <
                                                                0x7d) {
                                                              if (extra_cfg->max_partition_size - 4U
                                                                  < 0x7d) {
                                                                if ((uint)extra_cfg->
                                                                          max_partition_size <
                                                                    (uint)extra_cfg->
                                                                          min_partition_size) {
                                                                  pcVar12 = 
                                                  "min_partition_size out of range [..extra_cfg->max_partition_size]"
                                                  ;
                                                  }
                                                  else {
                                                    lVar14 = 0;
                                                    pcVar12 = 
                                                  "Target sequence level index is invalid";
                                                  do {
                                                    bVar1 = extra_cfg->target_seq_level_idx[lVar14];
                                                    if (bVar1 != 0x1f) {
                                                      if ((bVar1 != 0x20) &&
                                                         ((0xf7 < (byte)(bVar1 - 0x1c) ||
                                                          0xfd < (byte)(bVar1 - 0xc)) ||
                                                          (0x1b < bVar1 || (bVar1 & 0xfa) == 2)))
                                                      goto LAB_001898fa;
                                                    }
                                                    lVar14 = lVar14 + 1;
                                                  } while (lVar14 != 0x20);
                                                  if ((uint)extra_cfg->deltaq_strength < 0x3e9) {
                                                    if (extra_cfg->loopfilter_control < 4) {
                                                      if (extra_cfg->skip_postproc_filtering < 2) {
                                                        if (extra_cfg->enable_cdef < 4) {
                                                          if ((uint)extra_cfg->auto_intra_tools_off
                                                              < 2) {
                                                            if ((uint)extra_cfg->
                                                                      strict_level_conformance < 2)
                                                            {
                                                              if ((uint)extra_cfg->sb_qp_sweep < 2)
                                                              {
                                                                iVar13 = extra_cfg->
                                                                         kf_max_pyr_height;
                                                                if (iVar13 + 1U < 7) {
                                                                  if ((int)uVar4 <= iVar13 ||
                                                                      iVar13 == -1) {
                                                                    return AOM_CODEC_OK;
                                                                  }
                                                                  pcVar12 = 
                                                  "The value of kf-max-pyr-height should not be smaller than gf-min-pyr-height"
                                                  ;
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "kf_max_pyr_height out of range [-1..5]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "sb_qp_sweep expected boolean";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "strict_level_conformance expected boolean";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "auto_intra_tools_off expected boolean";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "enable_cdef out of range [..3]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "skip_postproc_filtering expected boolean";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "loopfilter_control out of range [..3]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "deltaq_strength out of range [0..1000]";
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "max_partition_size out of range [4..128]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "min_partition_size out of range [4..128]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "dv_cost_upd_freq out of range [0..3]"
                                                    ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "mv_cost_upd_freq out of range [0..3]"
                                                    ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "mode_cost_upd_freq out of range [0..3]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "coeff_cost_upd_freq out of range [0..3]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "disable_trellis_quant out of range [..3]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "chroma_subsampling_y out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "chroma_subsampling_x out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "enable_low_complexity_decode out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "enable_reduced_reference_set out of range [0..1]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "max_reference_frames out of range [3..7]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "film_grain_test_vector out of range [0..16]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "timing_info_type out of range [AOM_TIMING_UNSPECIFIED..AOM_TIMING_DEC_MODEL]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "dist_metric out of range [AOM_DIST_METRIC_PSNR..AOM_DIST_METRIC_QM_PSNR]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "tuning out of range [AOM_TUNE_PSNR..AOM_TUNE_SSIMULACRA2]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "color_range out of range [0..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "matrix_coefficients out of range [AOM_CICP_MC_IDENTITY..AOM_CICP_MC_ICTCP]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "transfer_characteristics out of range [AOM_CICP_TC_BT_709..AOM_CICP_TC_HLG]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "color_primaries out of range [AOM_CICP_CP_BT_709..AOM_CICP_CP_EBU_3213]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "content out of range [AOM_CONTENT_DEFAULT..AOM_CONTENT_INVALID - 1]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "g_input_bit_depth out of range [8..12]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "g_bit_depth out of range [AOM_BITS_8..AOM_BITS_12]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "cq_level out of range [..63]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "arnr_strength out of range [..6]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "arnr_max_frames out of range [..15]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "sharpness out of range [..7]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "Adaptive quantization are not supported in large scale tile coding."
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "monochrome out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "auto_tiles out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "tile_rows out of range [..6]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "tile_columns out of range [..6]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "fp_mt out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "row_mt out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "enable_rate_guide_deltaq out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "single_tile_decoding out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "large_scale_tile out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "superblock_size out of range [AOM_SUPERBLOCK_SIZE_64X64..AOM_SUPERBLOCK_SIZE_DYNAMIC]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "noise_sensitivity out of range [..6]"
                                                    ;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "enable_auto_bwd_ref out of range [..2]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "enable_auto_alt_ref out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "ext_tile_debug out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "sb_multipass_unit_test out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "motion_vector_unit_test out of range [..2]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "cdf_update_mode out of range [..2]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "rc_superres_kf_qthresh out of range [1..63]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "rc_superres_qthresh out of range [1..63]";
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "rc_superres_kf_denominator out of range [SCALE_NUMERATOR..SCALE_NUMERATOR << 1]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "rc_superres_denominator out of range [SCALE_NUMERATOR..SCALE_NUMERATOR << 1]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "rc_superres_mode out of range [..AOM_SUPERRES_AUTO]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "rc_resize_kf_denominator out of range [SCALE_NUMERATOR..SCALE_NUMERATOR << 1]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "rc_resize_denominator out of range [SCALE_NUMERATOR..SCALE_NUMERATOR << 1]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "rc_resize_mode out of range [..RESIZE_MODES - 1]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "gf_max_pyr_height out of range [..5]"
                                                    ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = "gf_min_pyr_height out of range [..5]"
                                                    ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "max_gf_interval out of range [AOMMAX(2, extra_cfg->min_gf_interval)..(MAX_LAG_BUFFERS - 1)]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "max_gf_interval out of range [..MAX_LAG_BUFFERS - 1]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "min_gf_interval out of range [..MAX_LAG_BUFFERS - 1]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "g_lag_in_frames out of range [..MAX_LAG_BUFFERS]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "g_pass out of range [AOM_RC_ONE_PASS..AOM_RC_THIRD_PASS]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "rc_dropframe_thresh out of range [..100]";
                                                  }
                                                }
                                                else {
                                                  pcVar12 = 
                                                  "kf_mode out of range [AOM_KF_DISABLED..AOM_KF_AUTO]"
                                                  ;
                                                }
                                              }
                                              else {
                                                pcVar12 = 
                                                "rc_2pass_vbr_bias_pct out of range [..100]";
                                              }
                                            }
                                            else {
                                              pcVar12 = "rc_overshoot_pct out of range [..100]";
                                            }
                                          }
                                          else {
                                            pcVar12 = "rc_undershoot_pct out of range [..100]";
                                          }
                                        }
                                        else {
                                          pcVar12 = "rc_end_usage out of range [AOM_VBR..AOM_Q]";
                                        }
                                      }
                                      else {
                                        pcVar12 = "g_threads out of range [..MAX_NUM_THREADS]";
                                      }
                                    }
                                    else {
                                      pcVar12 = "g_usage out of range [..AOM_USAGE_ALL_INTRA]";
                                    }
                                  }
                                  else {
                                    pcVar12 = "frame_periodic_boost out of range [..1]";
                                  }
                                }
                                else {
                                  pcVar12 = "deltalf_mode out of range [..1]";
                                }
                              }
                              else {
                                pcVar12 = "deltaq_mode out of range [..DELTA_Q_MODE_COUNT - 1]";
                              }
                            }
                            else {
                              pcVar12 = "aq_mode out of range [..AQ_MODE_COUNT - 1]";
                            }
                          }
                          else {
                            pcVar12 = "lossless expected boolean";
                          }
                        }
                        else {
                          pcVar12 = "rc_max_quantizer out of range [..63]";
                        }
                      }
                      else {
                        pcVar12 = "rc_target_bitrate out of range [..2000000]";
                      }
                    }
                    else {
                      pcVar12 = "g_profile out of range [..MAX_PROFILES - 1]";
                    }
                  }
                  else {
                    pcVar12 = "g_timebase.num out of range [1..1000000000]";
                  }
                }
                else {
                  pcVar12 = "g_timebase.den out of range [1..1000000000]";
                }
              }
              else {
                pcVar12 = "max_frame_area out of range [..2^30]";
              }
            }
            else {
              pcVar12 = "g_h out of range [..cfg->g_forced_max_frame_height]";
            }
          }
          else {
            pcVar12 = "g_w out of range [..cfg->g_forced_max_frame_width]";
          }
        }
        else {
          pcVar12 = "g_forced_max_frame_height out of range [..65536]";
        }
      }
      else {
        pcVar12 = "g_forced_max_frame_width out of range [..65536]";
      }
    }
    else {
      pcVar12 = "g_h out of range [1..65536]";
    }
  }
  else {
    pcVar12 = "g_w out of range [1..65536]";
  }
LAB_001898fa:
  (ctx->base).err_detail = pcVar12;
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t validate_config(aom_codec_alg_priv_t *ctx,
                                       const aom_codec_enc_cfg_t *cfg,
                                       const struct av1_extracfg *extra_cfg) {
  RANGE_CHECK(cfg, g_w, 1, 65536);                        // 16 bits available
  RANGE_CHECK(cfg, g_h, 1, 65536);                        // 16 bits available
  RANGE_CHECK_HI(cfg, g_forced_max_frame_width, 65536);   // 16 bits available
  RANGE_CHECK_HI(cfg, g_forced_max_frame_height, 65536);  // 16 bits available
  if (cfg->g_forced_max_frame_width) {
    RANGE_CHECK_HI(cfg, g_w, cfg->g_forced_max_frame_width);
  }
  if (cfg->g_forced_max_frame_height) {
    RANGE_CHECK_HI(cfg, g_h, cfg->g_forced_max_frame_height);
  }
  // To avoid integer overflows when multiplying width by height (or values
  // derived from width and height) using the int type, impose a maximum frame
  // area (width * height) of 2^30.
  const unsigned int max_frame_width =
      cfg->g_forced_max_frame_width ? cfg->g_forced_max_frame_width : cfg->g_w;
  const unsigned int max_frame_height = cfg->g_forced_max_frame_height
                                            ? cfg->g_forced_max_frame_height
                                            : cfg->g_h;
  const int64_t max_frame_area = (int64_t)max_frame_width * max_frame_height;
  if (max_frame_area > (1 << 30)) {
    ERROR("max_frame_area out of range [..2^30]");
  }
  RANGE_CHECK(cfg, g_timebase.den, 1, 1000000000);
  RANGE_CHECK(cfg, g_timebase.num, 1, 1000000000);
  RANGE_CHECK_HI(cfg, g_profile, MAX_PROFILES - 1);

  RANGE_CHECK_HI(cfg, rc_target_bitrate, 2000000);
  RANGE_CHECK_HI(cfg, rc_max_quantizer, 63);
  RANGE_CHECK_HI(cfg, rc_min_quantizer, cfg->rc_max_quantizer);
  RANGE_CHECK_BOOL(extra_cfg, lossless);
  RANGE_CHECK_HI(extra_cfg, aq_mode, AQ_MODE_COUNT - 1);
  RANGE_CHECK_HI(extra_cfg, deltaq_mode, DELTA_Q_MODE_COUNT - 1);

  if (cfg->g_usage != ALLINTRA &&
      extra_cfg->deltaq_mode == DELTA_Q_VARIANCE_BOOST) {
    ERROR("Variance Boost (deltaq_mode = 6) can only be set in all intra mode");
  }

  RANGE_CHECK_HI(extra_cfg, deltalf_mode, 1);
  RANGE_CHECK_HI(extra_cfg, frame_periodic_boost, 1);
#if CONFIG_REALTIME_ONLY
  RANGE_CHECK(cfg, g_usage, AOM_USAGE_REALTIME, AOM_USAGE_REALTIME);
#else
  RANGE_CHECK_HI(cfg, g_usage, AOM_USAGE_ALL_INTRA);
#endif
  RANGE_CHECK_HI(cfg, g_threads, MAX_NUM_THREADS);
  RANGE_CHECK(cfg, rc_end_usage, AOM_VBR, AOM_Q);
  RANGE_CHECK_HI(cfg, rc_undershoot_pct, 100);
  RANGE_CHECK_HI(cfg, rc_overshoot_pct, 100);
  RANGE_CHECK_HI(cfg, rc_2pass_vbr_bias_pct, 100);
  RANGE_CHECK(cfg, kf_mode, AOM_KF_DISABLED, AOM_KF_AUTO);
  RANGE_CHECK_HI(cfg, rc_dropframe_thresh, 100);
  RANGE_CHECK(cfg, g_pass, AOM_RC_ONE_PASS, AOM_RC_THIRD_PASS);
  RANGE_CHECK_HI(cfg, g_lag_in_frames, MAX_LAG_BUFFERS);
  if (cfg->g_usage == AOM_USAGE_ALL_INTRA) {
    RANGE_CHECK_HI(cfg, g_lag_in_frames, 0);
    RANGE_CHECK_HI(cfg, kf_max_dist, 0);
  }
  RANGE_CHECK_HI(extra_cfg, min_gf_interval, MAX_LAG_BUFFERS - 1);
  RANGE_CHECK_HI(extra_cfg, max_gf_interval, MAX_LAG_BUFFERS - 1);
  if (extra_cfg->max_gf_interval > 0) {
    RANGE_CHECK(extra_cfg, max_gf_interval,
                AOMMAX(2, extra_cfg->min_gf_interval), (MAX_LAG_BUFFERS - 1));
  }
  RANGE_CHECK_HI(extra_cfg, gf_min_pyr_height, 5);
  RANGE_CHECK_HI(extra_cfg, gf_max_pyr_height, 5);
  if (extra_cfg->gf_min_pyr_height > extra_cfg->gf_max_pyr_height) {
    ERROR(
        "gf_min_pyr_height must be less than or equal to "
        "gf_max_pyramid_height");
  }

  RANGE_CHECK_HI(cfg, rc_resize_mode, RESIZE_MODES - 1);
  RANGE_CHECK(cfg, rc_resize_denominator, SCALE_NUMERATOR,
              SCALE_NUMERATOR << 1);
  RANGE_CHECK(cfg, rc_resize_kf_denominator, SCALE_NUMERATOR,
              SCALE_NUMERATOR << 1);
  RANGE_CHECK_HI(cfg, rc_superres_mode, AOM_SUPERRES_AUTO);
  RANGE_CHECK(cfg, rc_superres_denominator, SCALE_NUMERATOR,
              SCALE_NUMERATOR << 1);
  RANGE_CHECK(cfg, rc_superres_kf_denominator, SCALE_NUMERATOR,
              SCALE_NUMERATOR << 1);
  RANGE_CHECK(cfg, rc_superres_qthresh, 1, 63);
  RANGE_CHECK(cfg, rc_superres_kf_qthresh, 1, 63);
  RANGE_CHECK_HI(extra_cfg, cdf_update_mode, 2);

  RANGE_CHECK_HI(extra_cfg, motion_vector_unit_test, 2);
#if CONFIG_FPMT_TEST
  RANGE_CHECK_HI(extra_cfg, fpmt_unit_test, 1);
#endif
  RANGE_CHECK_HI(extra_cfg, sb_multipass_unit_test, 1);
  RANGE_CHECK_HI(extra_cfg, ext_tile_debug, 1);
  RANGE_CHECK_HI(extra_cfg, enable_auto_alt_ref, 1);
  RANGE_CHECK_HI(extra_cfg, enable_auto_bwd_ref, 2);
  RANGE_CHECK(extra_cfg, cpu_used, 0,
              (cfg->g_usage == AOM_USAGE_REALTIME) ? 12 : 9);
  RANGE_CHECK_HI(extra_cfg, noise_sensitivity, 6);
  RANGE_CHECK(extra_cfg, superblock_size, AOM_SUPERBLOCK_SIZE_64X64,
              AOM_SUPERBLOCK_SIZE_DYNAMIC);
  RANGE_CHECK_HI(cfg, large_scale_tile, 1);
  RANGE_CHECK_HI(extra_cfg, single_tile_decoding, 1);
  RANGE_CHECK_HI(extra_cfg, enable_rate_guide_deltaq, 1);

  RANGE_CHECK_HI(extra_cfg, row_mt, 1);
  RANGE_CHECK_HI(extra_cfg, fp_mt, 1);

  RANGE_CHECK_HI(extra_cfg, tile_columns, 6);
  RANGE_CHECK_HI(extra_cfg, tile_rows, 6);
  RANGE_CHECK_HI(extra_cfg, auto_tiles, 1);

  RANGE_CHECK_HI(cfg, monochrome, 1);

  if (cfg->large_scale_tile && extra_cfg->aq_mode)
    ERROR(
        "Adaptive quantization are not supported in large scale tile "
        "coding.");

  RANGE_CHECK_HI(extra_cfg, sharpness, 7);
  RANGE_CHECK_HI(extra_cfg, arnr_max_frames, 15);
  RANGE_CHECK_HI(extra_cfg, arnr_strength, 6);
  RANGE_CHECK_HI(extra_cfg, cq_level, 63);
  RANGE_CHECK(cfg, g_bit_depth, AOM_BITS_8, AOM_BITS_12);
  RANGE_CHECK(cfg, g_input_bit_depth, 8, 12);
  RANGE_CHECK(extra_cfg, content, AOM_CONTENT_DEFAULT, AOM_CONTENT_INVALID - 1);

  if (cfg->g_pass >= AOM_RC_SECOND_PASS) {
    const size_t packet_sz = sizeof(FIRSTPASS_STATS);
    const int n_packets = (int)(cfg->rc_twopass_stats_in.sz / packet_sz);
    const FIRSTPASS_STATS *stats;

    if (cfg->rc_twopass_stats_in.buf == NULL)
      ERROR("rc_twopass_stats_in.buf not set.");

    if (cfg->rc_twopass_stats_in.sz % packet_sz)
      ERROR("rc_twopass_stats_in.sz indicates truncated packet.");

    if (cfg->rc_twopass_stats_in.sz < 2 * packet_sz)
      ERROR("rc_twopass_stats_in requires at least two packets.");

    stats =
        (const FIRSTPASS_STATS *)cfg->rc_twopass_stats_in.buf + n_packets - 1;

    if ((int)(stats->count + 0.5) != n_packets - 1)
      ERROR("rc_twopass_stats_in missing EOS stats packet");
  }

  if (extra_cfg->passes != -1 && cfg->g_pass == AOM_RC_ONE_PASS &&
      extra_cfg->passes != 1) {
    ERROR("One pass encoding but passes != 1.");
  }

  if (extra_cfg->passes != -1 && (int)cfg->g_pass > extra_cfg->passes) {
    ERROR("Current pass is larger than total number of passes.");
  }

  if (cfg->g_profile == (unsigned int)PROFILE_1 && cfg->monochrome) {
    ERROR("Monochrome is not supported in profile 1");
  }

  if (cfg->g_profile <= (unsigned int)PROFILE_1 &&
      cfg->g_bit_depth > AOM_BITS_10) {
    ERROR("Codec bit-depth 12 not supported in profile < 2");
  }
  if (cfg->g_profile <= (unsigned int)PROFILE_1 &&
      cfg->g_input_bit_depth > 10) {
    ERROR("Source bit-depth 12 not supported in profile < 2");
  }

  if (cfg->rc_end_usage == AOM_Q) {
    RANGE_CHECK_HI(cfg, use_fixed_qp_offsets, 1);
  } else {
    if (cfg->use_fixed_qp_offsets > 0) {
      ERROR("--use_fixed_qp_offsets can only be used with --end-usage=q");
    }
  }

  RANGE_CHECK(extra_cfg, color_primaries, AOM_CICP_CP_BT_709,
              AOM_CICP_CP_EBU_3213);  // Need to check range more precisely to
                                      // check for reserved values?
  RANGE_CHECK(extra_cfg, transfer_characteristics, AOM_CICP_TC_BT_709,
              AOM_CICP_TC_HLG);
  RANGE_CHECK(extra_cfg, matrix_coefficients, AOM_CICP_MC_IDENTITY,
              AOM_CICP_MC_ICTCP);
  RANGE_CHECK(extra_cfg, color_range, 0, 1);

  /* Average corpus complexity is supported only in the case of single pass
   * VBR*/
  if (cfg->g_pass == AOM_RC_ONE_PASS && cfg->rc_end_usage == AOM_VBR)
    RANGE_CHECK_HI(extra_cfg, vbr_corpus_complexity_lap,
                   MAX_VBR_CORPUS_COMPLEXITY);
  else if (extra_cfg->vbr_corpus_complexity_lap != 0)
    ERROR(
        "VBR corpus complexity is supported only in the case of single pass "
        "VBR mode.");

#if !CONFIG_TUNE_BUTTERAUGLI
  if (extra_cfg->tuning == AOM_TUNE_BUTTERAUGLI) {
    ERROR(
        "This error may be related to the wrong configuration options: try to "
        "set -DCONFIG_TUNE_BUTTERAUGLI=1 at the time CMake is run.");
  }
#endif

#if !CONFIG_TUNE_VMAF
  if (extra_cfg->tuning >= AOM_TUNE_VMAF_WITH_PREPROCESSING &&
      extra_cfg->tuning <= AOM_TUNE_VMAF_NEG_MAX_GAIN) {
    ERROR(
        "This error may be related to the wrong configuration options: try to "
        "set -DCONFIG_TUNE_VMAF=1 at the time CMake is run.");
  }
#endif

  RANGE_CHECK(extra_cfg, tuning, AOM_TUNE_PSNR, AOM_TUNE_SSIMULACRA2);

  RANGE_CHECK(extra_cfg, dist_metric, AOM_DIST_METRIC_PSNR,
              AOM_DIST_METRIC_QM_PSNR);

  RANGE_CHECK(extra_cfg, timing_info_type, AOM_TIMING_UNSPECIFIED,
              AOM_TIMING_DEC_MODEL);

  RANGE_CHECK(extra_cfg, film_grain_test_vector, 0, 16);

  if (extra_cfg->lossless) {
    if (extra_cfg->aq_mode != 0)
      ERROR("Only --aq_mode=0 can be used with --lossless=1.");
    if (extra_cfg->enable_chroma_deltaq)
      ERROR("Only --enable_chroma_deltaq=0 can be used with --lossless=1.");
  }

  RANGE_CHECK(extra_cfg, max_reference_frames, 3, 7);
  RANGE_CHECK(extra_cfg, enable_reduced_reference_set, 0, 1);

  RANGE_CHECK_HI(extra_cfg, enable_low_complexity_decode, 1);
  RANGE_CHECK_HI(extra_cfg, chroma_subsampling_x, 1);
  RANGE_CHECK_HI(extra_cfg, chroma_subsampling_y, 1);
  // 6.4.2 Color config semantics
  // If matrix_coefficients is equal to MC_IDENTITY, it is a requirement of
  // bitstream conformance that subsampling_x is equal to 0 and subsampling_y
  // is equal to 0.
  if (extra_cfg->matrix_coefficients == AOM_CICP_MC_IDENTITY &&
      (extra_cfg->chroma_subsampling_x != 0 ||
       extra_cfg->chroma_subsampling_y != 0)) {
    ERROR("Subsampling must be 0 with AOM_CICP_MC_IDENTITY.");
  }

  RANGE_CHECK_HI(extra_cfg, disable_trellis_quant, 3);
  RANGE_CHECK(extra_cfg, coeff_cost_upd_freq, 0, 3);
  RANGE_CHECK(extra_cfg, mode_cost_upd_freq, 0, 3);
  RANGE_CHECK(extra_cfg, mv_cost_upd_freq, 0, 3);
  RANGE_CHECK(extra_cfg, dv_cost_upd_freq, 0, 3);

  RANGE_CHECK(extra_cfg, min_partition_size, 4, 128);
  RANGE_CHECK(extra_cfg, max_partition_size, 4, 128);
  RANGE_CHECK_HI(extra_cfg, min_partition_size, extra_cfg->max_partition_size);

  for (int i = 0; i < MAX_NUM_OPERATING_POINTS; ++i) {
    const int level_idx = extra_cfg->target_seq_level_idx[i];
    if (!is_valid_seq_level_idx(level_idx) &&
        level_idx != SEQ_LEVEL_KEEP_STATS) {
      ERROR("Target sequence level index is invalid");
    }
  }

  RANGE_CHECK(extra_cfg, deltaq_strength, 0, 1000);
  RANGE_CHECK_HI(extra_cfg, loopfilter_control, 3);
  RANGE_CHECK_BOOL(extra_cfg, skip_postproc_filtering);
  RANGE_CHECK_HI(extra_cfg, enable_cdef, 3);
  RANGE_CHECK_BOOL(extra_cfg, auto_intra_tools_off);
  RANGE_CHECK_BOOL(extra_cfg, strict_level_conformance);
  RANGE_CHECK_BOOL(extra_cfg, sb_qp_sweep);

  RANGE_CHECK(extra_cfg, kf_max_pyr_height, -1, 5);
  if (extra_cfg->kf_max_pyr_height != -1 &&
      extra_cfg->kf_max_pyr_height < (int)extra_cfg->gf_min_pyr_height) {
    ERROR(
        "The value of kf-max-pyr-height should not be smaller than "
        "gf-min-pyr-height");
  }

  return AOM_CODEC_OK;
}